

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRProgram.cc
# Opt level: O1

IRHandler * __thiscall flow::IRProgram::createHandler(IRProgram *this,string *name)

{
  tuple<flow::IRHandler_*,_std::default_delete<flow::IRHandler>_> this_00;
  __uniq_ptr_impl<flow::IRHandler,_std::default_delete<flow::IRHandler>_> local_20;
  
  this_00.super__Tuple_impl<0UL,_flow::IRHandler_*,_std::default_delete<flow::IRHandler>_>.
  super__Head_base<0UL,_flow::IRHandler_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_flow::IRHandler_*,_std::default_delete<flow::IRHandler>_>)
       operator_new(0x68);
  IRHandler::IRHandler
            ((IRHandler *)
             this_00.
             super__Tuple_impl<0UL,_flow::IRHandler_*,_std::default_delete<flow::IRHandler>_>.
             super__Head_base<0UL,_flow::IRHandler_*,_false>._M_head_impl,name,this);
  local_20._M_t.super__Tuple_impl<0UL,_flow::IRHandler_*,_std::default_delete<flow::IRHandler>_>.
  super__Head_base<0UL,_flow::IRHandler_*,_false>._M_head_impl =
       (tuple<flow::IRHandler_*,_std::default_delete<flow::IRHandler>_>)
       (tuple<flow::IRHandler_*,_std::default_delete<flow::IRHandler>_>)
       this_00.super__Tuple_impl<0UL,_flow::IRHandler_*,_std::default_delete<flow::IRHandler>_>.
       super__Head_base<0UL,_flow::IRHandler_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<flow::IRHandler,std::default_delete<flow::IRHandler>>,std::allocator<std::unique_ptr<flow::IRHandler,std::default_delete<flow::IRHandler>>>>
  ::emplace_back<std::unique_ptr<flow::IRHandler,std::default_delete<flow::IRHandler>>>
            ((vector<std::unique_ptr<flow::IRHandler,std::default_delete<flow::IRHandler>>,std::allocator<std::unique_ptr<flow::IRHandler,std::default_delete<flow::IRHandler>>>>
              *)&this->handlers_,
             (unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_> *)&local_20);
  if ((_Tuple_impl<0UL,_flow::IRHandler_*,_std::default_delete<flow::IRHandler>_>)
      local_20._M_t.super__Tuple_impl<0UL,_flow::IRHandler_*,_std::default_delete<flow::IRHandler>_>
      .super__Head_base<0UL,_flow::IRHandler_*,_false>._M_head_impl != (IRHandler *)0x0) {
    (**(code **)(*(long *)local_20._M_t.
                          super__Tuple_impl<0UL,_flow::IRHandler_*,_std::default_delete<flow::IRHandler>_>
                          .super__Head_base<0UL,_flow::IRHandler_*,_false>._M_head_impl + 8))();
  }
  return (this->handlers_).
         super__Vector_base<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<flow::IRHandler,_std::default_delete<flow::IRHandler>_>._M_t.
         super__Tuple_impl<0UL,_flow::IRHandler_*,_std::default_delete<flow::IRHandler>_>.
         super__Head_base<0UL,_flow::IRHandler_*,_false>._M_head_impl;
}

Assistant:

IRHandler* IRProgram::createHandler(const std::string& name) {
  handlers_.emplace_back(std::make_unique<IRHandler>(name, this));
  return handlers_.back().get();
}